

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O1

void ihevc_sao_edge_offset_class3_chroma
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,UWORD8 *pu1_src_top_right,UWORD8 *pu1_src_bot_left,
               UWORD8 *pu1_avail,WORD8 *pi1_sao_offset_u,WORD8 *pi1_sao_offset_v,WORD32 wd,WORD32 ht
               )

{
  UWORD8 UVar1;
  UWORD8 UVar2;
  byte bVar3;
  UWORD8 UVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  UWORD8 *pUVar10;
  ulong uVar11;
  WORD8 *pWVar12;
  long lVar13;
  ulong uVar14;
  size_t __n;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  byte bVar18;
  ulong __n_00;
  byte *pbVar19;
  char cVar20;
  UWORD8 au1_mask [64];
  WORD8 au1_sign_up [64];
  UWORD8 au1_src_top_tmp [64];
  UWORD8 au1_src_left_tmp [128];
  byte local_1f0;
  byte local_1ec;
  byte local_1d4;
  UWORD8 *local_1c0;
  uint local_178 [15];
  char cStack_13c;
  char cStack_13b;
  char acStack_13a [66];
  undefined1 local_f8 [64];
  UWORD8 local_b8 [136];
  
  lVar9 = (long)wd;
  local_178[0] = 0xffffffff;
  local_178[1] = 0xffffffff;
  local_178[2] = 0xffffffff;
  local_178[3] = 0xffffffff;
  local_178[4] = 0xffffffff;
  local_178[5] = 0xffffffff;
  local_178[6] = 0xffffffff;
  local_178[7] = 0xffffffff;
  local_178[8] = 0xffffffff;
  local_178[9] = 0xffffffff;
  local_178[10] = 0xffffffff;
  local_178[0xb] = 0xffffffff;
  local_178[0xc] = 0xffffffff;
  local_178[0xd] = 0xffffffff;
  local_178[0xe] = 0xffffffff;
  cStack_13c = -1;
  cStack_13b = -1;
  acStack_13a[0] = -1;
  acStack_13a[1] = -1;
  lVar13 = lVar9 + -1;
  if (0 < ht) {
    pUVar10 = pu1_src + lVar13;
    uVar14 = 0;
    do {
      local_b8[uVar14 * 2] = pUVar10[-1];
      local_b8[uVar14 * 2 + 1] = *pUVar10;
      uVar14 = uVar14 + 1;
      pUVar10 = pUVar10 + src_strd;
    } while ((uint)ht != uVar14);
  }
  uVar14 = lVar9 - 2;
  UVar1 = pu1_src_top[lVar9 + -2];
  UVar2 = pu1_src_top[lVar9 + -1];
  __n_00 = (ulong)(uint)wd;
  if (0 < wd) {
    memcpy(local_f8,pu1_src + (ht + -1) * src_strd,__n_00);
  }
  local_1d4 = pu1_src[uVar14];
  if (pu1_avail[5] == '\0') {
    local_1f0 = pu1_src[lVar13];
  }
  else {
    uVar6 = local_1d4 == *pu1_src_top_right ^ 3;
    if (local_1d4 < *pu1_src_top_right) {
      uVar6 = 1;
    }
    uVar16 = 0xffffffff;
    if (pu1_src[wd + -4 + src_strd] <= local_1d4) {
      uVar16 = (uint)(local_1d4 != pu1_src[wd + -4 + src_strd]);
    }
    uVar5 = (uint)local_1d4;
    if (uVar16 + uVar6 != 2) {
      uVar6 = (int)pi1_sao_offset_u[gi4_ihevc_table_edge_idx[uVar16 + uVar6]] + (uint)local_1d4;
      uVar5 = 0xff;
      if (((int)uVar6 < 0x100) && (uVar5 = 0, 0 < (int)uVar6)) {
        uVar5 = uVar6;
      }
    }
    local_1d4 = (byte)uVar5;
    local_1f0 = pu1_src[lVar13];
    uVar6 = local_1f0 == pu1_src_top_right[1] ^ 3;
    if (local_1f0 < pu1_src_top_right[1]) {
      uVar6 = 1;
    }
    uVar16 = 0xffffffff;
    if (pu1_src[wd + -3 + src_strd] <= local_1f0) {
      uVar16 = (uint)(local_1f0 != pu1_src[wd + -3 + src_strd]);
    }
    if (uVar16 + uVar6 != 2) {
      iVar17 = (int)pi1_sao_offset_v[gi4_ihevc_table_edge_idx[uVar16 + uVar6]] + (uint)local_1f0;
      if (iVar17 < 0x100) {
        iVar7 = 0;
        if (0 < iVar17) {
          iVar7 = iVar17;
        }
        local_1f0 = (byte)iVar7;
      }
      else {
        local_1f0 = 0xff;
      }
    }
  }
  iVar17 = ht + -1;
  iVar7 = iVar17 * src_strd;
  bVar18 = pu1_src[iVar7];
  if (pu1_avail[6] == '\0') {
    local_1ec = pu1_src[(long)iVar7 + 1];
  }
  else {
    uVar6 = bVar18 == pu1_src[(iVar7 - src_strd) + 2] ^ 3;
    if (bVar18 < pu1_src[(iVar7 - src_strd) + 2]) {
      uVar6 = 1;
    }
    uVar16 = 0xffffffff;
    if (*pu1_src_bot_left <= bVar18) {
      uVar16 = (uint)(bVar18 != *pu1_src_bot_left);
    }
    uVar5 = (uint)bVar18;
    if (uVar16 + uVar6 != 2) {
      uVar6 = (int)pi1_sao_offset_u[gi4_ihevc_table_edge_idx[uVar16 + uVar6]] + (uint)bVar18;
      uVar5 = 0xff;
      if (((int)uVar6 < 0x100) && (uVar5 = 0, 0 < (int)uVar6)) {
        uVar5 = uVar6;
      }
    }
    bVar18 = (byte)uVar5;
    local_1ec = pu1_src[(long)iVar7 + 1];
    uVar6 = local_1ec == pu1_src[(iVar7 - src_strd) + 3] ^ 3;
    if (local_1ec < pu1_src[(iVar7 - src_strd) + 3]) {
      uVar6 = 1;
    }
    uVar16 = 0xffffffff;
    if (pu1_src_bot_left[1] <= local_1ec) {
      uVar16 = (uint)(local_1ec != pu1_src_bot_left[1]);
    }
    if (uVar16 + uVar6 != 2) {
      iVar7 = (int)pi1_sao_offset_v[gi4_ihevc_table_edge_idx[uVar16 + uVar6]] + (uint)local_1ec;
      local_1ec = 0xff;
      if (iVar7 < 0x100) {
        iVar8 = 0;
        if (0 < iVar7) {
          iVar8 = iVar7;
        }
        local_1ec = (byte)iVar8;
      }
    }
  }
  if (*pu1_avail == '\0') {
    local_178[0] = local_178[0] & 0xffffff00;
  }
  if (pu1_avail[2] == '\0') {
    pu1_src = pu1_src + src_strd;
    local_1c0 = pu1_src_left + 2;
    ht = iVar17;
    if (2 < wd) {
      uVar11 = 0;
      do {
        cVar20 = pu1_src[uVar11] != pu1_src[(2 - src_strd) + (int)uVar11];
        if (pu1_src[uVar11] < pu1_src[(2 - src_strd) + (int)uVar11]) {
          cVar20 = -1;
        }
        acStack_13a[uVar11 + 2] = cVar20;
        uVar11 = uVar11 + 1;
      } while ((uVar14 & 0xffffffff) != uVar11);
    }
  }
  else {
    local_1c0 = pu1_src_left;
    if (2 < wd) {
      uVar11 = 0;
      do {
        cVar20 = pu1_src[uVar11] != pu1_src_top[uVar11 + 2];
        if (pu1_src[uVar11] < pu1_src_top[uVar11 + 2]) {
          cVar20 = -1;
        }
        acStack_13a[uVar11 + 2] = cVar20;
        uVar11 = uVar11 + 1;
      } while ((uVar14 & 0xffffffff) != uVar11);
    }
  }
  if (pu1_avail[1] == '\0') {
    *(undefined1 *)((long)local_178 + (long)((int)lVar13 >> 1)) = 0;
  }
  uVar6 = ht - (uint)(pu1_avail[3] == '\0');
  if (0 < (int)uVar6) {
    iVar17 = 2;
    uVar11 = 0;
    do {
      cVar20 = pu1_src[uVar14] != pu1_src[wd - src_strd];
      if (pu1_src[uVar14] < pu1_src[wd - src_strd]) {
        cVar20 = -1;
      }
      acStack_13a[lVar9] = cVar20;
      cVar20 = pu1_src[lVar13] != pu1_src[(wd - src_strd) + 1];
      if (pu1_src[lVar13] < pu1_src[(wd - src_strd) + 1]) {
        cVar20 = -1;
      }
      acStack_13a[lVar9 + 1] = cVar20;
      if (0 < wd) {
        uVar15 = 0;
        do {
          pWVar12 = pi1_sao_offset_v;
          if ((uVar15 & 1) == 0) {
            pWVar12 = pi1_sao_offset_u;
          }
          pbVar19 = pu1_src + (src_strd + -2 + (int)uVar15);
          if (uVar15 < 2) {
            pbVar19 = local_1c0 + uVar15 + (long)iVar17;
          }
          bVar3 = pu1_src[uVar15];
          uVar16 = 0xffffffff;
          if (*pbVar19 <= bVar3) {
            pbVar19 = pu1_src + (src_strd + -2 + (int)uVar15);
            if (uVar15 < 2) {
              pbVar19 = local_1c0 + uVar15 + (long)iVar17;
            }
            uVar16 = (uint)(*pbVar19 < bVar3);
          }
          if (1 < uVar15) {
            acStack_13a[uVar15] = -(char)uVar16;
          }
          uVar16 = (uint)*(byte *)((long)local_178 + (uVar15 >> 1 & 0x7fffffff)) &
                   gi4_ihevc_table_edge_idx[(long)acStack_13a[uVar15 + 2] + (long)(int)uVar16 + 2];
          if (uVar16 != 0) {
            iVar7 = (int)pWVar12[uVar16] + (uint)bVar3;
            if (iVar7 < 1) {
              iVar7 = 0;
            }
            if (0xfe < iVar7) {
              iVar7 = 0xff;
            }
            pu1_src[uVar15] = (UWORD8)iVar7;
          }
          uVar15 = uVar15 + 1;
        } while (__n_00 != uVar15);
      }
      pu1_src = pu1_src + src_strd;
      uVar11 = uVar11 + 1;
      iVar17 = iVar17 + 2;
    } while (uVar11 != uVar6);
  }
  uVar5 = uVar6 + 1;
  uVar16 = uVar6;
  if (pu1_avail[2] == '\0') {
    uVar16 = uVar5;
  }
  pu1_src[(int)((wd - uVar16 * src_strd) + -2)] = local_1d4;
  uVar16 = uVar6;
  if (pu1_avail[2] == '\0') {
    uVar16 = uVar5;
  }
  pu1_src[(int)(~(uVar16 * src_strd) + wd)] = local_1f0;
  lVar13 = 0;
  if (pu1_avail[3] != '\0') {
    lVar13 = (long)-src_strd;
  }
  pu1_src[lVar13] = bVar18;
  lVar13 = 1;
  if (pu1_avail[3] != '\0') {
    lVar13 = (long)(1 - src_strd);
  }
  pu1_src[lVar13] = local_1ec;
  if (pu1_avail[2] == '\0') {
    uVar6 = uVar5;
  }
  UVar4 = pu1_avail[3];
  *pu1_src_top_left = UVar1;
  pu1_src_top_left[1] = UVar2;
  iVar17 = (UVar4 == '\0') + uVar6;
  if (iVar17 != 0 && SCARRY4((uint)(UVar4 == '\0'),uVar6) == iVar17 < 0) {
    __n = 1;
    if (1 < iVar17 * 2) {
      __n = (size_t)(uint)(iVar17 * 2);
    }
    memcpy(pu1_src_left,local_b8,__n);
  }
  if (0 < wd) {
    memcpy(pu1_src_top,local_f8,__n_00);
  }
  return;
}

Assistant:

void ihevc_sao_edge_offset_class3_chroma(UWORD8 *pu1_src,
                                         WORD32 src_strd,
                                         UWORD8 *pu1_src_left,
                                         UWORD8 *pu1_src_top,
                                         UWORD8 *pu1_src_top_left,
                                         UWORD8 *pu1_src_top_right,
                                         UWORD8 *pu1_src_bot_left,
                                         UWORD8 *pu1_avail,
                                         WORD8 *pi1_sao_offset_u,
                                         WORD8 *pi1_sao_offset_v,
                                         WORD32 wd,
                                         WORD32 ht)
{
    WORD32 row, col;
    UWORD8 au1_mask[MAX_CTB_SIZE];
    UWORD8 au1_src_left_tmp[2 * MAX_CTB_SIZE], au1_src_top_tmp[MAX_CTB_SIZE];
    UWORD8 au1_src_top_left_tmp[2];
    WORD8 au1_sign_up[MAX_CTB_SIZE];
    UWORD8 *pu1_src_left_cpy;
    WORD8 u1_sign_down;
    WORD32 bit_depth;

    UWORD8 u1_pos_wd_0_tmp_u;
    UWORD8 u1_pos_wd_0_tmp_v;
    UWORD8 u1_pos_0_ht_tmp_u;
    UWORD8 u1_pos_0_ht_tmp_v;

    bit_depth = BIT_DEPTH_CHROMA;
    pu1_src_left_cpy = pu1_src_left;

    /* Initialize the mask values */
    memset(au1_mask, 0xFF, MAX_CTB_SIZE);

    /* Update left, top and top-left arrays */
    au1_src_top_left_tmp[0] = pu1_src_top[wd - 2];
    au1_src_top_left_tmp[1] = pu1_src_top[wd - 1];
    for(row = 0; row < ht; row++)
    {
        au1_src_left_tmp[2 * row] = pu1_src[row * src_strd + wd - 2];
        au1_src_left_tmp[2 * row + 1] = pu1_src[row * src_strd + wd - 1];
    }
    for(col = 0; col < wd; col++)
    {
        au1_src_top_tmp[col] = pu1_src[(ht - 1) * src_strd + col];
    }


    /* If top-right is available, process separately */
    if(0 != pu1_avail[5])
    {
        WORD32 edge_idx;

        /* U */
        edge_idx = 2 + SIGN(pu1_src[wd - 2] - pu1_src_top_right[0]) +
                        SIGN(pu1_src[wd - 2] - pu1_src[wd - 2 - 2 + src_strd]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_wd_0_tmp_u = CLIP3(pu1_src[wd - 2] + pi1_sao_offset_u[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_wd_0_tmp_u = pu1_src[wd - 2];
        }

        /* V */
        edge_idx = 2 + SIGN(pu1_src[wd - 1] - pu1_src_top_right[1]) +
                        SIGN(pu1_src[wd - 1] - pu1_src[wd - 1 - 2 + src_strd]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_wd_0_tmp_v = CLIP3(pu1_src[wd - 1] + pi1_sao_offset_v[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_wd_0_tmp_v = pu1_src[wd - 1];
        }
    }
    else
    {
        u1_pos_wd_0_tmp_u = pu1_src[wd - 2];
        u1_pos_wd_0_tmp_v = pu1_src[wd - 1];
    }

    /* If bottom-left is available, process separately */
    if(0 != pu1_avail[6])
    {
        WORD32 edge_idx;

        /* U */
        edge_idx = 2 + SIGN(pu1_src[(ht - 1) * src_strd] - pu1_src[(ht - 1) * src_strd + 2 - src_strd]) +
                        SIGN(pu1_src[(ht - 1) * src_strd] - pu1_src_bot_left[0]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_0_ht_tmp_u = CLIP3(pu1_src[(ht - 1) * src_strd] + pi1_sao_offset_u[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_0_ht_tmp_u = pu1_src[(ht - 1) * src_strd];
        }

        /* V */
        edge_idx = 2 + SIGN(pu1_src[(ht - 1) * src_strd + 1] - pu1_src[(ht - 1) * src_strd + 1 + 2 - src_strd]) +
                        SIGN(pu1_src[(ht - 1) * src_strd + 1] - pu1_src_bot_left[1]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_0_ht_tmp_v = CLIP3(pu1_src[(ht - 1) * src_strd + 1] + pi1_sao_offset_v[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_0_ht_tmp_v = pu1_src[(ht - 1) * src_strd + 1];
        }
    }
    else
    {
        u1_pos_0_ht_tmp_u = pu1_src[(ht - 1) * src_strd];
        u1_pos_0_ht_tmp_v = pu1_src[(ht - 1) * src_strd + 1];
    }

    /* If Left is not available */
    if(0 == pu1_avail[0])
    {
        au1_mask[0] = 0;
    }

    /* If Top is not available */
    if(0 == pu1_avail[2])
    {
        pu1_src += src_strd;
        ht--;
        pu1_src_left_cpy += 2;
        for(col = 0; col < wd - 2; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src[col + 2 - src_strd]);
        }
    }
    else
    {
        for(col = 0; col < wd - 2; col++)
        {
            au1_sign_up[col] = SIGN(pu1_src[col] - pu1_src_top[col + 2]);
        }
    }

    /* If Right is not available */
    if(0 == pu1_avail[1])
    {
        au1_mask[(wd - 1) >> 1] = 0;
    }

    /* If Bottom is not available */
    if(0 == pu1_avail[3])
    {
        ht--;
    }

    /* Processing is done on the intermediate buffer and the output is written to the source buffer */
    {
        for(row = 0; row < ht; row++)
        {
            au1_sign_up[wd - 2] = SIGN(pu1_src[wd - 2] - pu1_src[wd - 2 + 2 - src_strd]);
            au1_sign_up[wd - 1] = SIGN(pu1_src[wd - 1] - pu1_src[wd - 1 + 2 - src_strd]);
            for(col = 0; col < wd; col++)
            {
                WORD32 edge_idx;
                WORD8 *pi1_sao_offset;

                pi1_sao_offset = (0 == col % 2) ? pi1_sao_offset_u : pi1_sao_offset_v;

                u1_sign_down = SIGN(pu1_src[col] - ((col < 2) ? pu1_src_left_cpy[2 * (row + 1) + col] :
                                                                pu1_src[col - 2 + src_strd]));
                edge_idx = 2 + au1_sign_up[col] + u1_sign_down;
                if(col > 1)
                    au1_sign_up[col - 2] = -u1_sign_down;

                edge_idx = gi4_ihevc_table_edge_idx[edge_idx] & au1_mask[col >> 1];

                if(0 != edge_idx)
                {
                    pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
                }
            }

            pu1_src += src_strd;
        }

        pu1_src[-(pu1_avail[2] ? ht : ht + 1) * src_strd + wd - 2] = u1_pos_wd_0_tmp_u;
        pu1_src[-(pu1_avail[2] ? ht : ht + 1) * src_strd + wd - 1] = u1_pos_wd_0_tmp_v;
        pu1_src[(pu1_avail[3] ?  (-src_strd) : 0)] = u1_pos_0_ht_tmp_u;
        pu1_src[(pu1_avail[3] ?  (-src_strd) : 0) + 1] = u1_pos_0_ht_tmp_v;
    }

    if(0 == pu1_avail[2])
        ht++;
    if(0 == pu1_avail[3])
        ht++;
    pu1_src_top_left[0] = au1_src_top_left_tmp[0];
    pu1_src_top_left[1] = au1_src_top_left_tmp[1];
    for(row = 0; row < 2 * ht; row++)
    {
        pu1_src_left[row] = au1_src_left_tmp[row];
    }
    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = au1_src_top_tmp[col];
    }

}